

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::~MembraneCallContextHook
          (MembraneCallContextHook *this)

{
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::dispose(&this->policy);
  kj::Own<capnp::CallContextHook,_std::nullptr_t>::dispose(&this->inner);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class MembraneCallContextHook final: public CallContextHook, public kj::Refcounted {
public:
  MembraneCallContextHook(kj::Own<CallContextHook>&& inner,
                          kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), reverse(reverse),
        paramsCapTable(*this->policy, reverse),
        resultsCapTable(*this->policy, reverse) {}

  AnyPointer::Reader getParams() override {
    KJ_REQUIRE(!releasedParams);
    KJ_IF_SOME(p, params) {
      return p;
    } else {
      auto result = paramsCapTable.imbue(inner->getParams());
      params = result;
      return result;
    }
  }

  void releaseParams() override {
    // Note that releaseParams() is idempotent -- it can be called multiple times.
    releasedParams = true;
    inner->releaseParams();
  }